

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.h
# Opt level: O0

void __thiscall
slang::ast::CoverageBinSymbol::visitExprs<only_assigned_on_reset::AlwaysFFVisitor&>
          (CoverageBinSymbol *this,AlwaysFFVisitor *visitor)

{
  bool bVar1;
  reference ppEVar2;
  TransRangeList *this_00;
  iterator visitor_00;
  CoverageBinSymbol *in_RDI;
  TransRangeList *rangeList;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL> *__range3;
  span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL> *set;
  iterator __end2_1;
  iterator __begin2_1;
  span<const_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>,_18446744073709551615UL>
  *__range2_1;
  Expression *val;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range2;
  BinsSelectExpr *expr_4;
  Expression *expr_3;
  Expression *expr_2;
  Expression *expr_1;
  Expression *expr;
  CoverageBinSymbol *in_stack_ffffffffffffff38;
  AlwaysFFVisitor *in_stack_ffffffffffffff48;
  BinsSelectExpr *in_stack_ffffffffffffff50;
  __normal_iterator<const_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_*,_std::span<const_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>,_18446744073709551615UL>_>
  local_88;
  span<const_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>,_18446744073709551615UL>
  local_80;
  span<const_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>,_18446744073709551615UL>
  *local_70;
  Expression *local_68;
  Expression **local_60;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_58;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_50;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_40;
  BinsSelectExpr *local_38;
  Expression *local_30;
  Expression *local_28;
  Expression *local_20;
  Expression *local_18;
  
  local_18 = getIffExpr(in_RDI);
  if (local_18 != (Expression *)0x0) {
    Expression::visit<only_assigned_on_reset::AlwaysFFVisitor&>
              ((Expression *)in_RDI,(AlwaysFFVisitor *)in_stack_ffffffffffffff38);
  }
  local_20 = getNumberOfBinsExpr(in_RDI);
  if (local_20 != (Expression *)0x0) {
    Expression::visit<only_assigned_on_reset::AlwaysFFVisitor&>
              ((Expression *)in_RDI,(AlwaysFFVisitor *)in_stack_ffffffffffffff38);
  }
  local_28 = getSetCoverageExpr(in_RDI);
  if (local_28 != (Expression *)0x0) {
    Expression::visit<only_assigned_on_reset::AlwaysFFVisitor&>
              ((Expression *)in_RDI,(AlwaysFFVisitor *)in_stack_ffffffffffffff38);
  }
  local_30 = getWithExpr(in_RDI);
  if (local_30 != (Expression *)0x0) {
    Expression::visit<only_assigned_on_reset::AlwaysFFVisitor&>
              ((Expression *)in_RDI,(AlwaysFFVisitor *)in_stack_ffffffffffffff38);
  }
  local_38 = getCrossSelectExpr(in_RDI);
  if (local_38 != (BinsSelectExpr *)0x0) {
    BinsSelectExpr::visit<only_assigned_on_reset::AlwaysFFVisitor>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  local_50 = getValues(in_stack_ffffffffffffff38);
  local_40 = &local_50;
  local_58._M_current =
       (Expression **)
       std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                  in_stack_ffffffffffffff38);
  local_60 = (Expression **)
             std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                       ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                        in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_RDI,
                       (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff38);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
              ::operator*(&local_58);
    local_68 = *ppEVar2;
    Expression::visit<only_assigned_on_reset::AlwaysFFVisitor&>
              ((Expression *)in_RDI,(AlwaysFFVisitor *)in_stack_ffffffffffffff38);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator++(&local_58);
  }
  local_80 = getTransList(in_stack_ffffffffffffff38);
  local_70 = &local_80;
  local_88._M_current =
       (span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL> *)
       std::
       span<const_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>,_18446744073709551615UL>
       ::begin((span<const_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>,_18446744073709551615UL>
                *)in_stack_ffffffffffffff38);
  std::
  span<const_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>,_18446744073709551615UL>
  ::end((span<const_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>,_18446744073709551615UL>
         *)in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_*,_std::span<const_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>,_18446744073709551615UL>_>
                      ((__normal_iterator<const_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_*,_std::span<const_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>,_18446744073709551615UL>_>
                        *)in_RDI,
                       (__normal_iterator<const_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_*,_std::span<const_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff38);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_00 = (TransRangeList *)
              __gnu_cxx::
              __normal_iterator<const_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_*,_std::span<const_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>,_18446744073709551615UL>_>
              ::operator*(&local_88);
    visitor_00 = std::
                 span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>::
                 begin((span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>
                        *)in_stack_ffffffffffffff38);
    std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>::end
              ((span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL> *)
               in_stack_ffffffffffffff48);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_slang::ast::CoverageBinSymbol::TransRangeList_*,_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
                        ((__normal_iterator<const_slang::ast::CoverageBinSymbol::TransRangeList_*,_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
                          *)in_RDI,
                         (__normal_iterator<const_slang::ast::CoverageBinSymbol::TransRangeList_*,_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
                          *)in_stack_ffffffffffffff38);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      in_stack_ffffffffffffff48 =
           (AlwaysFFVisitor *)
           __gnu_cxx::
           __normal_iterator<const_slang::ast::CoverageBinSymbol::TransRangeList_*,_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
           ::operator*((__normal_iterator<const_slang::ast::CoverageBinSymbol::TransRangeList_*,_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
                        *)&stack0xffffffffffffff58);
      TransRangeList::visitExprs<only_assigned_on_reset::AlwaysFFVisitor&>
                (this_00,(AlwaysFFVisitor *)visitor_00._M_current);
      __gnu_cxx::
      __normal_iterator<const_slang::ast::CoverageBinSymbol::TransRangeList_*,_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
      ::operator++((__normal_iterator<const_slang::ast::CoverageBinSymbol::TransRangeList_*,_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
                    *)&stack0xffffffffffffff58);
    }
    __gnu_cxx::
    __normal_iterator<const_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_*,_std::span<const_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>,_18446744073709551615UL>_>
    ::operator++(&local_88);
  }
  return;
}

Assistant:

void CoverageBinSymbol::visitExprs(TVisitor&& visitor) const {
    if (auto expr = getIffExpr())
        expr->visit(visitor);
    if (auto expr = getNumberOfBinsExpr())
        expr->visit(visitor);
    if (auto expr = getSetCoverageExpr())
        expr->visit(visitor);
    if (auto expr = getWithExpr())
        expr->visit(visitor);
    if (auto expr = getCrossSelectExpr())
        expr->visit(visitor);

    for (auto val : getValues())
        val->visit(visitor);

    for (auto& set : getTransList()) {
        for (auto& rangeList : set)
            rangeList.visitExprs(visitor);
    }
}